

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

bool __thiscall just::test::test_case::run(test_case *this,ostream *report_)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(report_,"Running ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (report_,(this->_name)._M_dataplus._M_p,(this->_name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*this->_f)();
  return true;
}

Assistant:

bool run(std::ostream& report_) const
      {
        report_ << "Running " << _name << std::endl;
        try
        {
          _f();
          return true;
        }
        catch (const assertion_failed& e_)
        {
          report_
            << "  Assertion failed" << std::endl
            << "    " << e_.msg() << std::endl
            << "    Test case: " << _name << std::endl
            << "    Location: " << e_.filename() << ":" << e_.line() <<std::endl
            ;
        }
        catch (const std::exception& e_)
        {
          report_
            << "  std::exception thrown" << std::endl
            << "    what: " << e_.what() << std::endl
            << "    Test case: " << _name << std::endl;
        }
        catch (...)
        {
          report_
            << "  Exception thrown" << std::endl
            << "    Test case: " << _name << std::endl;
        }
        return false;
      }